

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.hpp
# Opt level: O1

void __thiscall
PieceWiseCubicSpline<2>::_Spline::interp
          (_Spline *this,PieceWiseCubicSpline<2> *host,vector<double,_std::allocator<double>_> *t,
          VectorXd *y)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  double *pdVar6;
  double *pdVar7;
  _Spline *p_Var8;
  PieceWiseCubicSpline<2> *pPVar9;
  Index size;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  pointer rows;
  double dVar19;
  VectorXd d;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  ActualDstType actualDst;
  SparseMatrix<double,_0,_int> A;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  assign_op<double,_double> local_329;
  Matrix<double,__1,_1,_0,__1,_1> local_328;
  SrcXprType local_318;
  _Spline *local_308;
  VectorXd *local_300;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> local_2f8;
  pointer local_2e0;
  ulong local_2d8;
  PieceWiseCubicSpline<2> *local_2d0;
  SparseMatrix<double,_0,_int> local_2c8;
  long local_280;
  pointer local_278 [2];
  _Alloc_hider local_268;
  long local_238;
  
  uVar15 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_2d0 = host;
  if ((long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start >> 3 != uVar15) {
    __assert_fail("t.size() == y.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                  ,0x44,
                  "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                 );
  }
  this->t_ptr = t;
  pdVar3 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_308 = this;
  local_300 = y;
  if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar15) {
    if ((long)uVar15 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->y,uVar15,uVar15,1);
  }
  uVar16 = (local_308->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (uVar16 != uVar15) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                 );
  }
  pdVar4 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  uVar12 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      pdVar6 = pdVar3 + lVar14;
      dVar19 = pdVar6[1];
      pdVar7 = pdVar4 + lVar14;
      *pdVar7 = *pdVar6;
      pdVar7[1] = dVar19;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar12);
  }
  if ((long)uVar12 < (long)uVar16) {
    do {
      pdVar4[uVar12] = pdVar3[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
  }
  iVar17 = (int)uVar15;
  local_2e0 = (pointer)(long)iVar17;
  local_268._M_p = (pointer)0x0;
  local_278[0] = local_2e0;
  if ((long)local_2e0 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_328,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_278);
  local_2f8.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = uVar15 << 0x20;
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::reserve
            (&local_2f8,(long)((uVar15 << 0x20) * 3) >> 0x20);
  uVar18 = iVar17 - 1;
  local_2c8._0_4_ = 1;
  local_2d8 = uVar15;
  if (2 < iVar17) {
    do {
      if ((int)local_2c8._0_4_ < -1) goto LAB_00107541;
      lVar13 = (long)(int)(local_2c8._0_4_ + 1);
      lVar14 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_rows;
      if ((((lVar14 <= lVar13) || (local_2c8._0_4_ == 0xffffffff)) ||
          (lVar10 = (long)(int)local_2c8._0_4_, lVar14 <= lVar10)) || ((int)local_2c8._0_4_ < 1))
      goto LAB_00107541;
      lVar11 = (long)(int)(local_2c8._0_4_ - 1);
      if (lVar14 <= lVar11) goto LAB_00107541;
      if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          <= lVar10) goto LAB_00107560;
      pdVar3 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar10] = (pdVar3[lVar13] - pdVar3[lVar10]) / (pdVar5[lVar13] - pdVar5[lVar10]) -
                 (pdVar3[lVar10] - pdVar3[lVar11]) / (pdVar5[lVar10] - pdVar5[lVar11]);
      local_278[0] = (pointer)((pdVar5[lVar10] - pdVar5[lVar11]) / 3.0);
      local_318.m_dec._0_4_ = local_2c8._0_4_ - 1;
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar19 = pdVar5[(long)(int)local_2c8._0_4_ + 1] - pdVar5[(long)(int)local_2c8._0_4_ + -1];
      local_278[0] = (pointer)((dVar19 + dVar19) / 3.0);
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int&,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_2f8,(int *)&local_2c8,(int *)&local_2c8,(double *)local_278);
      local_318.m_dec =
           (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
           CONCAT44(local_318.m_dec._4_4_,local_2c8._0_4_ + 1);
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_278[0] = (pointer)((pdVar5[(long)(int)local_2c8._0_4_ + 1] -
                               pdVar5[(int)local_2c8._0_4_]) / 3.0);
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
      local_2c8._0_4_ = local_2c8._0_4_ + 1;
    } while ((int)local_2c8._0_4_ < (int)uVar18);
  }
  pPVar9 = local_2d0;
  if (local_2d0->left_condition_ == FirstDeriv) {
    local_2c8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    local_2c8._1_3_ = 0;
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         ((ulong)local_318.m_dec._4_4_ << 0x20);
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = pdVar3[1] - *pdVar3;
    local_278[0] = (pointer)(dVar19 + dVar19);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    local_2c8._0_4_ = 0;
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_318.m_dec._4_4_,1);
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_278[0] = (pointer)(pdVar3[1] - *pdVar3);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    iVar17 = (int)local_2d8;
    if ((local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        < 2) goto LAB_00107541;
    if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        1) goto LAB_00107560;
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    *local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         ((pdVar4[1] - *pdVar4) / (pdVar3[1] - *pdVar3) - pPVar9->left_cond_value_) * 3.0;
    rows = local_2e0;
  }
  else {
    if (local_2d0->left_condition_ != SecondDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x65,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_2c8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    local_2c8._1_3_ = 0;
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         ((ulong)local_318.m_dec._4_4_ << 0x20);
    local_278[0] = (pointer)0x4000000000000000;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    rows = local_2e0;
    local_2c8._0_4_ = 0;
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_318.m_dec._4_4_,1);
    local_278[0] = (pointer)0x0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    iVar17 = (int)local_2d8;
    if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        1) goto LAB_00107560;
    *local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pPVar9->left_cond_value_;
  }
  lVar14 = (long)(int)uVar18;
  local_318.m_dec._0_4_ = uVar18;
  if (pPVar9->right_condition_ == FirstDeriv) {
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = pdVar5[lVar14] - pdVar5[(long)iVar17 + -2];
    local_278[0] = (pointer)(dVar19 + dVar19);
    local_2c8._0_4_ = uVar18;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    lVar13 = (long)iVar17 + -2;
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_318.m_dec._4_4_,iVar17 + -2);
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_278[0] = (pointer)(pdVar5[lVar14] - pdVar5[lVar13]);
    local_2c8._0_4_ = uVar18;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    if (((iVar17 < 1) ||
        (lVar10 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows, lVar10 <= lVar14)) || ((iVar17 == 1 || (lVar10 <= lVar13)))) {
LAB_00107541:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        lVar14) goto LAB_00107560;
    pdVar3 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = (local_2d0->right_cond_value_ -
             (pdVar3[lVar14] - pdVar3[lVar13]) / (pdVar5[lVar14] - pdVar5[lVar13])) * 3.0;
  }
  else {
    if (pPVar9->right_condition_ != SecondDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x77,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_278[0] = (pointer)0x4000000000000000;
    local_2c8._0_4_ = uVar18;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    local_318.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_318.m_dec._4_4_,iVar17 + -2);
    local_278[0] = (pointer)0x0;
    local_2c8._0_4_ = uVar18;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_2f8,(int *)&local_2c8,(int *)&local_318,(double *)local_278);
    if ((iVar17 < 1) ||
       (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        lVar14)) goto LAB_00107560;
    dVar19 = local_2d0->right_cond_value_;
  }
  local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar14]
       = dVar19;
  local_2c8._0_4_ = local_2c8._0_4_ & 0xffffff00;
  local_2c8.m_outerSize = 0;
  local_2c8.m_innerSize = 0;
  local_2c8.m_outerIndex = (StorageIndex *)0x0;
  local_2c8.m_innerNonZeros = (StorageIndex *)0x0;
  local_2c8.m_data.m_values = (Scalar *)0x0;
  local_2c8.m_data.m_indices = (StorageIndex *)0x0;
  local_2c8.m_data.m_size = 0;
  local_2c8.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_2c8,(Index)rows,(Index)rows);
  local_278[0] = local_2f8.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_318.m_dec =
       (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
       local_2f8.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_278,&local_318,&local_2c8,&local_329);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
            );
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
             ,&local_2c8);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
             ,&local_2c8);
  p_Var8 = local_308;
  if (local_278[0]._0_1_ ==
      (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
       )0x0) {
    __assert_fail("m_isInitialized && \"Solver is not initialized.\"",
                  "/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5a,
                  "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double>>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::SparseLU<Eigen::SparseMatrix<double>>, Rhs = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_238 !=
      local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    __assert_fail("derived().rows()==b.rows() && \"solve(): invalid number of rows of the right hand side matrix b\""
                  ,"/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5b,
                  "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double>>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::SparseLU<Eigen::SparseMatrix<double>>, Rhs = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_318.m_rhs = &local_328;
  local_2e0 = (pointer)&local_308->b;
  local_318.m_dec =
       (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)local_2e0,&local_318,&local_329);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&p_Var8->a,(Index)rows,(Index)rows,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_308->c,(Index)rows,(Index)rows,1);
  if (1 < (int)local_2d8) {
    lVar13 = (local_308->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    pdVar3 = (local_308->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_308->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    uVar15 = (local_308->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    pdVar6 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar10 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar13 < 2) {
      lVar13 = 1;
    }
    uVar16 = 0;
    if ((long)uVar15 < 1) {
      uVar15 = uVar16;
    }
    uVar12 = (local_308->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    lVar11 = 1;
    if (1 < lVar10) {
      lVar11 = lVar10;
    }
    if ((long)uVar12 < 1) {
      uVar12 = uVar16;
    }
    pdVar7 = (local_308->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    do {
      if ((lVar13 - 1U == uVar16) || (uVar15 == uVar16)) goto LAB_00107560;
      pdVar4[uVar16] =
           ((pdVar3[uVar16 + 1] - pdVar3[uVar16]) / (pdVar5[uVar16 + 1] - pdVar5[uVar16])) / 3.0;
      if (lVar11 - 1U == uVar16) goto LAB_00107541;
      if (uVar12 == uVar16) goto LAB_00107560;
      pdVar7[uVar16] =
           ((pdVar3[uVar16] + pdVar3[uVar16] + pdVar3[uVar16 + 1]) *
           (pdVar5[uVar16 + 1] - pdVar5[uVar16])) / -3.0 +
           (pdVar6[uVar16 + 1] - pdVar6[uVar16]) / (pdVar5[uVar16 + 1] - pdVar5[uVar16]);
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  bVar2 = local_2d0->force_linear_extrapolation_;
  dVar19 = 0.0;
  if (bVar2 == false) {
    if ((local_308->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 1) goto LAB_00107560;
    dVar19 = **(double **)local_2e0;
  }
  local_308->b0 = dVar19;
  lVar13 = (local_308->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (0 < lVar13) {
    pdVar3 = (local_308->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    local_308->c0 = *pdVar3;
    if ((0 < (int)local_2d8) &&
       (lVar10 = (local_308->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows, lVar14 < lVar10)) {
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar19 = pdVar5[lVar14] - *(double *)((long)pdVar5 + (local_280 + -0x200000000 >> 0x1d));
      lVar11 = local_280 + -0x200000000 >> 0x20;
      pdVar4 = (p_Var8->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar4[lVar14] = 0.0;
      if (((-1 < lVar11) &&
          (((lVar11 < lVar10 &&
            (lVar10 = (local_308->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows, lVar11 < lVar10)) && (lVar11 < lVar13)))) &&
         (lVar14 < lVar13)) {
        lVar13 = *(long *)local_2e0;
        dVar1 = *(double *)(lVar13 + lVar11 * 8);
        pdVar3[lVar14] =
             pdVar4[lVar11] * 3.0 * dVar19 * dVar19 + (dVar1 + dVar1) * dVar19 + pdVar3[lVar11];
        if (bVar2 != false) {
          if (lVar10 <= lVar14) goto LAB_00107560;
          *(undefined8 *)(lVar13 + lVar14 * 8) = 0;
        }
        Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                  ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                   local_278);
        free(local_2c8.m_outerIndex);
        free(local_2c8.m_innerNonZeros);
        Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_2c8.m_data);
        if (local_2f8.
            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2f8.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2f8.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2f8.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        free(local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        return;
      }
    }
  }
LAB_00107560:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void interp(PieceWiseCubicSpline<>& host, const vector<double>& t, const Eigen::VectorXd& y) {
      assert(t.size() == y.size());
      const int N = y.size();
      this->t_ptr = &t;
      this->y = y;

      // build Am=d
      Eigen::VectorXd d = Eigen::VectorXd::Zero(N);
      vector<Eigen::Triplet<double>> triplets;
      triplets.reserve(3 * N);

      // build h
      for (int i = 1; i < N - 1; ++i) {
        d[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) - (y[i] - y[i - 1]) / (t[i] - t[i - 1]);
        triplets.emplace_back(i, i - 1, (t[i] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i, 2 * (t[i + 1] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i + 1, (t[i + 1] - t[i]) / 3.0);
      }

      // boundary conditions
      if (host.left_condition_ == SecondDeriv) {
        // 2*b[0] = f''
        triplets.emplace_back(0, 0, 2.0);
        triplets.emplace_back(0, 1, 0.0);

        d[0] = host.left_cond_value_;
      } else if (host.left_condition_ == FirstDeriv) {
        // c[0] = f', needs to be re-expressed in terms of b:
        // (2b[0]+b[1])(x[1]-x[0]) = 3 ((y[1]-y[0])/(x[1]-x[0]) - f')
        triplets.emplace_back(0, 0, 2.0 * (t[1] - t[0]));
        triplets.emplace_back(0, 1, 1.0 * (t[1] - t[0]));

        d[0] = 3.0 * ((y[1] - y[0]) / (t[1] - t[0]) - host.left_cond_value_);
      } else {
        assert(false);
      }
      if (host.right_condition_ == SecondDeriv) {
        // 2*b[n-1] = f''
        triplets.emplace_back(N - 1, N - 1, 2.0);
        triplets.emplace_back(N - 1, N - 2, 0.0);

        d[N - 1] = host.right_cond_value_;

      } else if (host.right_condition_ == FirstDeriv) {
        // c[n-1] = f', needs to be re-expressed in terms of b:
        // (b[n-2]+2b[n-1])(x[n-1]-x[n-2])
        // = 3 (f' - (y[n-1]-y[n-2])/(x[n-1]-x[n-2]))
        triplets.emplace_back(N - 1, N - 1, 2.0 * (t[N - 1] - t[N - 2]));
        triplets.emplace_back(N - 1, N - 2, 1.0 * (t[N - 1] - t[N - 2]));

        d[N - 1] = 3.0 * (host.right_cond_value_ - (y[N - 1] - y[N - 2]) / (t[N - 1] - t[N - 2]));
      } else {
        assert(false);
      }

      // solve the equation system to obtain the parameters b[]
      Eigen::SparseMatrix<double> A(N, N);
      A.setFromTriplets(triplets.begin(), triplets.end());

      Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
      solver.compute(A);
      b = solver.solve(d);

      a.resize(N);
      c.resize(N);
      for (int i = 0; i < N - 1; i++) {
        a[i] = (b[i + 1] - b[i]) / (t[i + 1] - t[i]) / 3.0;
        c[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) -
               (2.0 * b[i] + b[i + 1]) * (t[i + 1] - t[i]) / 3.0;
      }

      // for left extrapolation coefficients
      b0 = (!host.force_linear_extrapolation_) ? b[0] : 0.0;
      c0 = c[0];

      // for the right extrapolation coefficients
      // f_{n-1}(x) = b*(x-x_{n-1})^2 + c*(x-x_{n-1}) + y{n-1}
      double h = t[N - 1] - t[N - 2];
      // b[N-1] is determined by the boundary condition
      a[N - 1] = 0.0;
      c[N - 1] = 3.0 * a[N - 2] * h * h + 2.0 * b[N - 2] * h + c[N - 2];  // = f'_{n-2}(x_{n-1})
      if (host.force_linear_extrapolation_) {
        {
          b[N - 1] = 0.0;
        }
      }
    }